

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O3

void __thiscall
msgpack11::Value<(msgpack11::MsgPack::Type)4,_short>::dump
          (Value<(msgpack11::MsgPack::Type)4,_short> *this,string *out)

{
  char cVar1;
  long lVar2;
  EndianConverter<short> converter;
  
  cVar1 = (char)out;
  std::__cxx11::string::push_back(cVar1);
  if ((anonymous_namespace)::is_big_endian == '\x01') {
    lVar2 = 0;
    do {
      std::__cxx11::string::push_back(cVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 2);
  }
  else {
    lVar2 = 2;
    do {
      std::__cxx11::string::push_back(cVar1);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void dump(std::string &out) const override { msgpack11::dump(m_value, out); }